

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O1

immutable_string __thiscall
ut::test_case_impl<agge::tests::PathGeneratorAdapterTests>::name
          (test_case_impl<agge::tests::PathGeneratorAdapterTests> *this)

{
  _func_int **__dest;
  DeleterF extraout_RDX;
  DeleterF extraout_RDX_00;
  DeleterF extraout_RDX_01;
  DeleterF p_Var1;
  long in_RSI;
  immutable_string iVar2;
  allocator local_39;
  undefined1 *local_38;
  size_t local_30;
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)&local_38,*(char **)(in_RSI + 0x18),&local_39);
  __dest = (_func_int **)operator_new__(local_30 + 1);
  (this->super_test_case).super_destructible._vptr_destructible = __dest;
  p_Var1 = extraout_RDX;
  if (local_30 != 0) {
    memmove(__dest,local_38,local_30);
    p_Var1 = extraout_RDX_00;
  }
  *(undefined1 *)((long)__dest + local_30) = 0;
  this->_method = (method_t)exportable::immutable_basic_string<char>::deallocate;
  if (local_38 != local_28) {
    operator_delete(local_38);
    p_Var1 = extraout_RDX_01;
  }
  iVar2._deleter = p_Var1;
  iVar2._text = (char *)this;
  return iVar2;
}

Assistant:

inline exportable::immutable_string test_case_impl<Fixture>::name() const
	{	return _name;	}